

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_constant_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowConstantAggregatorGlobalState::WindowConstantAggregatorGlobalState
          (WindowConstantAggregatorGlobalState *this,ClientContext *context,
          WindowConstantAggregator *aggregator,idx_t group_count,ValidityMask *partition_mask)

{
  vector<unsigned_long,_true> *this_00;
  unsigned_long *puVar1;
  idx_t __p;
  WindowConstantAggregatorGlobalState *pWVar2;
  ulong uVar3;
  ulong uVar4;
  unsigned_long uVar5;
  idx_t start;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *local_60;
  WindowAggregateStates *local_58;
  WindowConstantAggregatorGlobalState *local_50;
  WindowConstantAggregator *local_48;
  idx_t group_count_local;
  unsigned_long local_38;
  
  group_count_local = group_count;
  WindowAggregatorGlobalState::WindowAggregatorGlobalState
            (&this->super_WindowAggregatorGlobalState,context,&aggregator->super_WindowAggregator,
             0x800);
  (this->super_WindowAggregatorGlobalState).super_WindowAggregatorState._vptr_WindowAggregatorState
       = (_func_int **)&PTR__WindowConstantAggregatorGlobalState_017aa528;
  this_00 = &this->partition_offsets;
  (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->partition_offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58 = &this->statef;
  local_50 = this;
  WindowAggregateStates::WindowAggregateStates
            (local_58,&(this->super_WindowAggregatorGlobalState).aggr);
  (this->results).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = (Vector *)0x0;
  local_60 = &this->results;
  if ((partition_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
      (unsigned_long *)0x0) {
    start = (ulong)start._4_4_ << 0x20;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<int>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,(int *)&start);
  }
  else {
    start = 0;
    uVar3 = 0;
    local_48 = aggregator;
    while (aggregator = local_48, uVar3 < group_count) {
      puVar1 = (partition_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      uVar5 = 0xffffffffffffffff;
      if (puVar1 != (unsigned_long *)0x0) {
        uVar5 = puVar1[uVar3 >> 6];
      }
      uVar4 = (ulong)((uint)uVar3 & 0x3f);
      if (uVar5 == 0 && uVar4 == 0) {
        uVar3 = uVar3 + 0x40;
        start = uVar3;
      }
      else {
        while ((uVar4 < 0x40 && (uVar3 < group_count))) {
          if ((uVar5 >> (uVar4 & 0x3f) & 1) != 0) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00,&start);
            uVar3 = start;
          }
          uVar4 = uVar4 + 1;
          uVar3 = uVar3 + 1;
          start = uVar3;
        }
      }
    }
  }
  pWVar2 = local_50;
  local_38 = (long)(local_50->partition_offsets).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(local_50->partition_offsets).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  make_uniq<duckdb::Vector,duckdb::LogicalType_const&,unsigned_long>
            ((duckdb *)&start,&(aggregator->super_WindowAggregator).result_type,&local_38);
  __p = start;
  start = 0;
  ::std::__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::reset
            ((__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)local_60,
             (pointer)__p);
  ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
            ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)&start);
  WindowAggregateStates::Initialize
            (local_58,(long)(pWVar2->partition_offsets).
                            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pWVar2->partition_offsets).
                            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
  ::std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00,&group_count_local);
  return;
}

Assistant:

WindowConstantAggregatorGlobalState::WindowConstantAggregatorGlobalState(ClientContext &context,
                                                                         const WindowConstantAggregator &aggregator,
                                                                         idx_t group_count,
                                                                         const ValidityMask &partition_mask)
    : WindowAggregatorGlobalState(context, aggregator, STANDARD_VECTOR_SIZE), statef(aggr) {

	// Locate the partition boundaries
	if (partition_mask.AllValid()) {
		partition_offsets.emplace_back(0);
	} else {
		idx_t entry_idx;
		idx_t shift;
		for (idx_t start = 0; start < group_count;) {
			partition_mask.GetEntryIndex(start, entry_idx, shift);

			//	If start is aligned with the start of a block,
			//	and the block is blank, then skip forward one block.
			const auto block = partition_mask.GetValidityEntry(entry_idx);
			if (partition_mask.NoneValid(block) && !shift) {
				start += ValidityMask::BITS_PER_VALUE;
				continue;
			}

			// Loop over the block
			for (; shift < ValidityMask::BITS_PER_VALUE && start < group_count; ++shift, ++start) {
				if (partition_mask.RowIsValid(block, shift)) {
					partition_offsets.emplace_back(start);
				}
			}
		}
	}

	//	Initialise the vector for caching the results
	results = make_uniq<Vector>(aggregator.result_type, partition_offsets.size());

	//	Initialise the final states
	statef.Initialize(partition_offsets.size());

	// Add final guard
	partition_offsets.emplace_back(group_count);
}